

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O0

Image<float,_gimage::PixelTraits<float>_> *
gimage::operator*=(Image<float,_gimage::PixelTraits<float>_> *image,double s)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  store_t_conflict1 sVar4;
  float v;
  long i;
  long k;
  int d;
  work_t in_stack_ffffffffffffffb8;
  store_t_conflict1 in_stack_ffffffffffffffbc;
  Image<float,_gimage::PixelTraits<float>_> *this;
  long i_00;
  int iVar5;
  Image<float,_gimage::PixelTraits<float>_> *local_28;
  long local_20;
  int local_14;
  
  local_14 = 0;
  while (iVar5 = local_14, iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RDI),
        iVar5 < iVar2) {
    local_20 = 0;
    while (i_00 = local_20, lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RDI),
          i_00 < lVar3) {
      local_28 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
      while (this = local_28, lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI),
            (long)this < lVar3) {
        sVar4 = Image<float,_gimage::PixelTraits<float>_>::get
                          (in_RDI,(long)local_28,local_20,local_14);
        bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidS(this,in_stack_ffffffffffffffbc);
        if (bVar1) {
          Image<float,_gimage::PixelTraits<float>_>::setLimited
                    ((Image<float,_gimage::PixelTraits<float>_> *)CONCAT44(sVar4,iVar5),i_00,
                     (long)this,(int)in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
        }
        local_28 = (Image<float,_gimage::PixelTraits<float>_> *)((long)&local_28->depth + 1);
      }
      local_20 = local_20 + 1;
    }
    local_14 = local_14 + 1;
  }
  return in_RDI;
}

Assistant:

Image<T> &operator*=(Image<T> &image, double s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, static_cast<typename Image<T>::work_t>(v*s));
        }
      }
    }
  }

  return image;
}